

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool tinyusdz::value::IsLerpSupportedType(uint32_t tyid)

{
  bool bVar1;
  bool bVar2;
  uint32_t in_EDX;
  storage_t<unsigned_int> sVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  undefined1 local_78 [8];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  char local_50;
  string local_48;
  
  TryGetUnderlyingTypeName_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,(value *)(ulong)tyid,in_EDX);
  bVar1 = local_78[0];
  local_50 = local_78[0];
  if (local_78[0] == true) {
    if (local_70.data.__align == (anon_struct_8_0_00000001_for___align)((long)&local_70 + 0x10)) {
      local_48.field_2._8_8_ = local_70._24_8_;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    }
    else {
      local_48._M_dataplus._M_p = (pointer)local_70.data._0_8_;
    }
    local_48.field_2._M_allocated_capacity._1_7_ = local_70._17_7_;
    local_48.field_2._M_local_buf[0] = local_70._16_1_;
    local_48._M_string_length = local_70._8_8_;
    local_70._8_8_ = 0;
    local_70._16_1_ = 0;
    local_70.data._0_8_ = (undefined8)((long)&local_70 + 0x10);
  }
  sVar3 = (storage_t<unsigned_int>)0x0;
  if (local_78[0] == true) {
    TryGetTypeId((optional<unsigned_int> *)local_78,&local_48);
    sVar3 = (storage_t<unsigned_int>)0x0;
    if (local_78[0] != false) {
      sVar3 = (storage_t<unsigned_int>)local_78._4_4_;
    }
  }
  if ((local_50 == '\x01') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  bVar2 = true;
  if (tyid != 0xe) {
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x11) {
        return true;
      }
    }
    else {
      if (tyid == 0xe) {
        return true;
      }
      if (tyid == 0x11) {
        return true;
      }
      if (tyid == 0x10000e) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x12) {
        return true;
      }
    }
    else {
      if (tyid - 0x11 < 2) {
        return true;
      }
      if (tyid == 0x100011) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x13) {
        return true;
      }
    }
    else {
      if (tyid - 0x12 < 2) {
        return true;
      }
      if (tyid == 0x100012) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x28) {
        return true;
      }
    }
    else {
      if (tyid == 0x13) {
        return true;
      }
      if (tyid == 0x28) {
        return true;
      }
      if (tyid == 0x100013) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x29) {
        return true;
      }
    }
    else {
      if (tyid - 0x28 < 2) {
        return true;
      }
      if (tyid == 0x100028) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2a) {
        return true;
      }
    }
    else {
      if (tyid - 0x29 < 2) {
        return true;
      }
      if (tyid == 0x100029) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2b) {
        return true;
      }
    }
    else {
      if (tyid - 0x2a < 2) {
        return true;
      }
      if (tyid == 0x10002a) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2c) {
        return true;
      }
    }
    else {
      if (tyid - 0x2b < 2) {
        return true;
      }
      if (tyid == 0x10002b) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2d) {
        return true;
      }
    }
    else {
      if (tyid - 0x2c < 2) {
        return true;
      }
      if (tyid == 0x10002c) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2e) {
        return true;
      }
    }
    else {
      if (tyid - 0x2d < 2) {
        return true;
      }
      if (tyid == 0x10002d) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x2f) {
        return true;
      }
    }
    else {
      if (tyid - 0x2e < 2) {
        return true;
      }
      if (tyid == 0x10002e) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x30) {
        return true;
      }
    }
    else {
      if (tyid - 0x2f < 2) {
        return true;
      }
      if (tyid == 0x10002f) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x31) {
        return true;
      }
    }
    else {
      if (tyid - 0x30 < 2) {
        return true;
      }
      if (tyid == 0x100030) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x32) {
        return true;
      }
    }
    else {
      if (tyid - 0x31 < 2) {
        return true;
      }
      if (tyid == 0x100031) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x36) {
        return true;
      }
    }
    else {
      if (tyid == 0x32) {
        return true;
      }
      if (tyid == 0x36) {
        return true;
      }
      if (tyid == 0x100032) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if (tyid == 0x37) {
        return true;
      }
    }
    else {
      if (tyid - 0x36 < 2) {
        return true;
      }
      if (tyid == 0x100036) {
        return true;
      }
    }
    if ((tyid >> 0x14 & 1) == 0) {
      if ((tyid | 0x100000) == 0x100038) {
        return true;
      }
    }
    else {
      if (tyid - 0x37 < 2) {
        return true;
      }
      if (tyid - 0x100037 < 2) {
        return true;
      }
    }
    if ((bVar1 == false) ||
       (((0x38 < (uint)sVar3 || ((0x1c7ff00000e4000U >> ((ulong)(uint)sVar3 & 0x3f) & 1) == 0)) &&
        ((0x2a < (int)sVar3 - 0x10000eU ||
         ((0x71ffc000039U >> ((ulong)((int)sVar3 - 0x10000eU) & 0x3f) & 1) == 0)))))) {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool IsLerpSupportedType(uint32_t tyid) {

  // TODO: Directly get underlying_typeid
  bool has_underlying_tyid{false};
  uint32_t underlying_tyid{TYPE_ID_INVALID};

  if (auto pv = TryGetUnderlyingTypeName(tyid)) {
    underlying_tyid = GetTypeId(pv.value());
    has_underlying_tyid = true;
  } 

  // See also for underlying_type_id to simplify check for Role types(e.g. color3f)
#define IS_SUPPORTED_TYPE(__tyid, __ty) \
  if (__tyid == value::TypeTraits<__ty>::type_id()) { \
    return true; \
  } else if (__tyid == value::TypeTraits<__ty>::underlying_type_id()) { \
    return true; \
  } else if (__tyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::type_id())) { \
      return true; \
    } else if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::underlying_type_id())) { \
      return true; \
    } \
  }

  // Assume __uty is underlying_type.
#define IS_SUPPORTED_UNDERLYING_TYPE(__utyid, __uty) \
  if (__utyid == value::TypeTraits<__uty>::type_id()) { \
    return true; \
  } else if (__utyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__utyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__uty>::type_id())) { \
      return true; \
    } \
  }

  IS_SUPPORTED_TYPE(tyid, value::half)
  IS_SUPPORTED_TYPE(tyid, value::half2)
  IS_SUPPORTED_TYPE(tyid, value::half3)
  IS_SUPPORTED_TYPE(tyid, value::half4)
  IS_SUPPORTED_TYPE(tyid, float)
  IS_SUPPORTED_TYPE(tyid, value::float2)
  IS_SUPPORTED_TYPE(tyid, value::float3)
  IS_SUPPORTED_TYPE(tyid, value::float4)
  IS_SUPPORTED_TYPE(tyid, double)
  IS_SUPPORTED_TYPE(tyid, value::double2)
  IS_SUPPORTED_TYPE(tyid, value::double3)
  IS_SUPPORTED_TYPE(tyid, value::double4)
  IS_SUPPORTED_TYPE(tyid, value::quath)
  IS_SUPPORTED_TYPE(tyid, value::quatf)
  IS_SUPPORTED_TYPE(tyid, value::quatd)
  IS_SUPPORTED_TYPE(tyid, value::matrix2d)
  IS_SUPPORTED_TYPE(tyid, value::matrix3d)
  IS_SUPPORTED_TYPE(tyid, value::matrix4d)

  if (has_underlying_tyid) {
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, float)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, double)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quath)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatf)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatd)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix2d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix3d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix4d)
  }

#undef IS_SUPPORTED_TYPE
#undef IS_SUPPORTED_UNDERLYING_TYPE

  return false;

}